

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SuitPlayCapability.cpp
# Opt level: O0

vector<Card,_std::allocator<Card>_> * __thiscall
SuitPlayCapability::get_possible_player_cards
          (vector<Card,_std::allocator<Card>_> *__return_storage_ptr__,SuitPlayCapability *this,
          vector<Card,_std::allocator<Card>_> *unknown_cards)

{
  bool bVar1;
  int iVar2;
  reference this_00;
  Card *card;
  iterator __end1;
  iterator __begin1;
  vector<Card,_std::allocator<Card>_> *__range1;
  vector<Card,_std::allocator<Card>_> *unknown_cards_local;
  SuitPlayCapability *this_local;
  vector<Card,_std::allocator<Card>_> *possible_cards;
  
  std::vector<Card,_std::allocator<Card>_>::vector(__return_storage_ptr__);
  __end1 = std::vector<Card,_std::allocator<Card>_>::begin(unknown_cards);
  card = (Card *)std::vector<Card,_std::allocator<Card>_>::end(unknown_cards);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<Card_*,_std::vector<Card,_std::allocator<Card>_>_>
                                     *)&card), bVar1) {
    this_00 = __gnu_cxx::__normal_iterator<Card_*,_std::vector<Card,_std::allocator<Card>_>_>::
              operator*(&__end1);
    if (((this->m_can_play_spades & 1U) != 0) && (iVar2 = Card::get_suit(this_00), iVar2 == 0)) {
      std::vector<Card,_std::allocator<Card>_>::push_back(__return_storage_ptr__,this_00);
    }
    if (((this->m_can_play_hearts & 1U) != 0) && (iVar2 = Card::get_suit(this_00), iVar2 == 1)) {
      std::vector<Card,_std::allocator<Card>_>::push_back(__return_storage_ptr__,this_00);
    }
    if (((this->m_can_play_diamonds & 1U) != 0) && (iVar2 = Card::get_suit(this_00), iVar2 == 2)) {
      std::vector<Card,_std::allocator<Card>_>::push_back(__return_storage_ptr__,this_00);
    }
    if (((this->m_can_play_clubs & 1U) != 0) && (iVar2 = Card::get_suit(this_00), iVar2 == 3)) {
      std::vector<Card,_std::allocator<Card>_>::push_back(__return_storage_ptr__,this_00);
    }
    __gnu_cxx::__normal_iterator<Card_*,_std::vector<Card,_std::allocator<Card>_>_>::operator++
              (&__end1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<Card> SuitPlayCapability::get_possible_player_cards(std::vector<Card> unknown_cards)
{
    std::vector<Card> possible_cards;

    for(auto const &card : unknown_cards) {
        if(m_can_play_spades && card.get_suit() == 0) {
            possible_cards.push_back(card);
        }
        if(m_can_play_hearts && card.get_suit() == 1) {
            possible_cards.push_back(card);
        }
        if(m_can_play_diamonds && card.get_suit() == 2) {
            possible_cards.push_back(card);
        }
        if(m_can_play_clubs && card.get_suit() == 3) {
            possible_cards.push_back(card);
        }
    }

    return possible_cards;
}